

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

TabCompletion * __thiscall duckdb::Linenoise::TabComplete(Linenoise *this)

{
  undefined1 uVar1;
  long in_RSI;
  Completion *in_RDI;
  Completion c;
  idx_t i;
  char prev_char;
  linenoiseCompletions lc;
  TabCompletion *result;
  linenoiseCompletions *in_stack_ffffffffffffff70;
  Completion *this_00;
  string local_70 [8];
  char **in_stack_ffffffffffffff98;
  vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *in_stack_ffffffffffffffa0;
  ulong local_48;
  ulong local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  TabCompletion::TabCompletion((TabCompletion *)0x1f762e);
  if (completionCallback != (code *)0x0) {
    local_20 = 0;
    local_28 = 0;
    uVar1 = *(undefined1 *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x28));
    *(undefined1 *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x28)) = 0;
    (*completionCallback)(*(undefined8 *)(in_RSI + 8),&local_28);
    *(undefined1 *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x28)) = uVar1;
    ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::reserve
              (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
      in_stack_ffffffffffffff70 = (linenoiseCompletions *)local_70;
      Completion::Completion((Completion *)0x1f76e3);
      ::std::__cxx11::string::operator=
                ((string *)in_stack_ffffffffffffff70,*(char **)(local_20 + local_48 * 8));
      ::std::__cxx11::string::size();
      ::std::__cxx11::string::operator+=
                (local_70,(char *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x28)));
      ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::
      emplace_back<duckdb::Completion>
                ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)this_00,in_RDI);
      Completion::~Completion((Completion *)0x1f7749);
    }
    freeCompletions(in_stack_ffffffffffffff70);
  }
  return (TabCompletion *)this_00;
}

Assistant:

TabCompletion Linenoise::TabComplete() const {
	TabCompletion result;
	if (!completionCallback) {
		return result;
	}
	linenoiseCompletions lc;
	lc.cvec = nullptr;
	lc.len = 0;
	// complete based on the cursor position
	auto prev_char = buf[pos];
	buf[pos] = '\0';
	completionCallback(buf, &lc);
	buf[pos] = prev_char;
	result.completions.reserve(lc.len);
	for (idx_t i = 0; i < lc.len; i++) {
		Completion c;
		c.completion = lc.cvec[i];
		c.cursor_pos = c.completion.size();
		c.completion += buf + pos;
		result.completions.emplace_back(std::move(c));
	}
	freeCompletions(&lc);
	return result;
}